

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void xc_rho2dzeta(int nspin,double *rho,double *d,double *zeta)

{
  double dVar1;
  double dVar2;
  
  dVar1 = *rho;
  if (nspin == 1) {
    dVar2 = 0.0;
    if (0.0 <= dVar1) {
      dVar2 = dVar1;
    }
    *d = dVar2;
    dVar2 = 0.0;
  }
  else {
    dVar1 = dVar1 + rho[1];
    *d = dVar1;
    if (dVar1 <= 0.0) {
      *d = 0.0;
      dVar2 = 0.0;
    }
    else {
      dVar1 = (*rho - rho[1]) / dVar1;
      if (1.0 <= dVar1) {
        dVar1 = 1.0;
      }
      dVar2 = -1.0;
      if (-1.0 <= dVar1) {
        dVar2 = dVar1;
      }
    }
  }
  *zeta = dVar2;
  return;
}

Assistant:

GPU_FUNCTION void
xc_rho2dzeta(int nspin, const double *rho, double *d, double *zeta)
{
  if(nspin==XC_UNPOLARIZED){
    *d    = m_max(rho[0], 0.0);
    *zeta = 0.0;
  }else{
    *d = rho[0] + rho[1];
    if(*d > 0.0){
      *zeta = (rho[0] - rho[1])/(*d);
      *zeta = m_min(*zeta,  1.0);
      *zeta = m_max(*zeta, -1.0);
    }else{
      *d    = 0.0;
      *zeta = 0.0;
    }
  }
}